

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O3

void MAFSA_automaton_enumerate_ints
               (MAFSA_automaton ma,MAFSA_letter *l,size_t sz_l,MAFSA_letter *tmp,size_t sz_tmp,
               MAFSA_letter delim,void *user_data,MAFSA_automaton_string_handler fetcher)

{
  uint32_t *puVar1;
  ulong uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  MAFSA_stack_struct local_28;
  
  puVar1 = ma->ptr_nodes;
  uVar4 = *puVar1;
  local_28.current = -1;
  uVar2 = 0;
  if (sz_l != 0) {
    do {
      uVar3 = uVar4 & 0x7fffffff;
      uVar4 = ma->ptr_links[uVar3];
      if (uVar4 == 0xff000000) {
        return;
      }
      while (uVar3 = uVar3 + 1, l[uVar2] != (MAFSA_letter)(uVar4 >> 0x18)) {
        uVar4 = ma->ptr_links[uVar3];
        if (uVar4 == 0xff000000) {
          return;
        }
      }
      if ((uVar4 & 0xffffff) == 0) {
        return;
      }
      uVar4 = puVar1[uVar4 & 0xffffff];
      uVar2 = (ulong)((int)uVar2 + 1);
    } while (uVar2 < sz_l);
  }
  if (uVar2 == sz_l) {
    uVar5 = uVar4 & 0x7fffffff;
    uVar3 = ma->ptr_links[uVar5];
    while (uVar3 != 0xff000000) {
      uVar5 = uVar5 + 1;
      if ((MAFSA_letter)(uVar3 >> 0x18) == delim) {
        if ((uVar3 & 0xffffff) == 0) {
          return;
        }
        local_28.buffer = tmp;
        local_28.reserved = sz_tmp;
        enumerate_ints(ma,&local_28,puVar1[uVar3 & 0xffffff],fetcher,user_data);
        return;
      }
      uVar3 = ma->ptr_links[uVar5];
    }
  }
  return;
}

Assistant:

static void MAFSA_automaton_enumerate_ints(MAFSA_automaton ma, const MAFSA_letter *l, size_t sz_l, MAFSA_letter *tmp,
    size_t sz_tmp, MAFSA_letter delim, void *user_data, MAFSA_automaton_string_handler fetcher)
{
    uint32_t i;
    uint32_t current = ma->ptr_nodes[0];
    uint32_t where = 1;

    struct MAFSA_stack_struct tmp_stack;

    tmp_stack.buffer   = tmp;
    tmp_stack.reserved = sz_tmp;
    tmp_stack.current  = -1;

    for (i = 0; i < sz_l; i++)
    {
        MAFSA_letter label = l[i];

        if (0 != (where = MAFSA_delta(ma->ptr_links, current, label)))
        {
            current = ma->ptr_nodes[where];
        }
        else
        {
            break;
        }
    }

    if (i == sz_l && where)
    {
        if (0 != (where = MAFSA_delta(ma->ptr_links, current, delim)))
        {
            enumerate_ints(ma, &tmp_stack, ma->ptr_nodes[where], fetcher, user_data);
        }
    }
}